

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O2

void __thiscall ast::Dir_byte::~Dir_byte(Dir_byte *this)

{
  _List_node_base *p_Var1;
  _List_base<ast::Expression_*,_std::allocator<ast::Expression_*>_> *this_00;
  _List_node_base *p_Var2;
  
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Dir_byte_0013b880;
  p_Var1 = (_List_node_base *)this->value_list;
  p_Var2 = p_Var1;
  while (p_Var2 = (((_List_base<ast::Expression_*,_std::allocator<ast::Expression_*>_> *)
                   &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != p_Var1) {
    if (p_Var2[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)(*(long *)p_Var2[1]._M_next + 8))();
    }
  }
  this_00 = &this->value_list->
             super__List_base<ast::Expression_*,_std::allocator<ast::Expression_*>_>;
  if (this_00 != (_List_base<ast::Expression_*,_std::allocator<ast::Expression_*>_> *)0x0) {
    std::__cxx11::_List_base<ast::Expression_*,_std::allocator<ast::Expression_*>_>::_M_clear
              (this_00);
  }
  operator_delete(this_00);
  Statement::~Statement((Statement *)this);
  return;
}

Assistant:

Dir_byte::~Dir_byte()
{
	for (auto s: *value_list)
		delete s;
	delete value_list;
}